

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  bool bVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  float __x;
  float __x_00;
  
  uVar2 = action ^ 1;
  if (key == 0x100 && uVar2 == 0) {
    glfwSetWindowShouldClose(window,1);
  }
  else if (key == 0x48 && uVar2 == 0) {
    currentMode = (currentMode + 1) % numMode;
  }
  else if (key == 0x43 && uVar2 == 0) {
    fVar3 = def_r + 0.1;
    __x = def_g + 0.1;
    __x_00 = def_b + 0.1;
    fVar4 = floorf(fVar3);
    def_r = fVar3 - fVar4;
    fVar3 = floorf(__x);
    def_g = __x - fVar3;
    fVar3 = floorf(__x_00);
    def_b = __x_00 - fVar3;
  }
  else {
    if (key == 0x106 && uVar2 == 0) {
      CMU462::MeshResampler::upsample(mesh);
    }
    else {
      if (key != 0x107 || uVar2 != 0) {
        if (0x3ff < (uint)key) {
          return;
        }
        bVar1 = true;
        if (action != 1) {
          if (action != 0) {
            return;
          }
          bVar1 = false;
        }
        goto LAB_00108ea3;
      }
      CMU462::MeshResampler::downsample(mesh);
    }
    mesh_dirty = true;
  }
  bVar1 = true;
LAB_00108ea3:
  keys[(uint)key] = bVar1;
  return;
}

Assistant:

void key_callback(GLFWwindow *window, int key, [[maybe_unused]] int scancode, int action, [[maybe_unused]] int mods) {
    if (key == GLFW_KEY_ESCAPE && action == GLFW_PRESS)
        glfwSetWindowShouldClose(window, GL_TRUE);
    if (key == GLFW_KEY_H && action == GLFW_PRESS) {
        currentMode = (currentMode + 1) % numMode;
    }
    if (key == GLFW_KEY_C && action == GLFW_PRESS) {
        def_r += 0.1f;
        def_g += 0.1f;
        def_b += 0.1f;
        def_r -= floor(def_r);
        def_g -= floor(def_g);
        def_b -= floor(def_b);
    }
    if (key == GLFW_KEY_RIGHT && action == GLFW_PRESS) {
        MeshResampler::upsample(*mesh);
        mesh_dirty = true;
    }
    if (key == GLFW_KEY_LEFT && action == GLFW_PRESS) {
        MeshResampler::downsample(*mesh);
        mesh_dirty = true;
    }
    if (key >= 0 && key < 1024) {
        if (action == GLFW_PRESS)
            keys[key] = true;
        else if (action == GLFW_RELEASE)
            keys[key] = false;
    }
}